

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

void __thiscall
TidyConfigParser::toggleAllGroupChecks(TidyConfigParser *this,string *groupName,CheckStatus status)

{
  bool bVar1;
  _Optional_payload_base<slang::TidyKind> this_00;
  undefined8 in_RSI;
  value<fmt::v11::context> *in_RDI;
  optional<slang::TidyKind> kind;
  undefined1 in_stack_00000150 [16];
  undefined1 in_stack_00000160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined1 *puVar2;
  string *in_stack_ffffffffffffff18;
  _Alloc_hider in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  TidyConfigParser *in_stack_ffffffffffffff48;
  undefined1 local_a8 [36];
  _Optional_payload_base<slang::TidyKind> local_84;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48;
  undefined8 uStack_40;
  undefined8 local_30;
  char *local_28;
  undefined8 uStack_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8;
  
  puVar2 = local_a8;
  local_78 = in_RSI;
  std::__cxx11::string::string
            (in_stack_ffffffffffffff30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff28._M_p);
  this_00 = (_Optional_payload_base<slang::TidyKind>)
            slang::tidyKindFromStr(in_stack_ffffffffffffff18);
  local_84 = this_00;
  std::__cxx11::string::~string(in_stack_fffffffffffffef0);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::TidyKind> *)0x20c367);
  if (!bVar1) {
    local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff28;
    local_28 = "Group {} does not exist";
    uStack_20 = 0x17;
    local_30 = local_78;
    local_48 = "Group {} does not exist";
    uStack_40 = 0x17;
    in_stack_fffffffffffffef0 = &local_68;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              (in_RDI,local_18);
    local_8 = &local_68.field_2;
    local_68.field_2._M_allocated_capacity = 0xd;
    local_10 = in_stack_fffffffffffffef0;
    local_68.field_2._8_8_ = in_stack_fffffffffffffef0;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000160,(format_args)in_stack_00000150);
    reportErrorAndExit(in_stack_ffffffffffffff48,(string *)in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
  }
  std::optional<slang::TidyKind>::value((optional<slang::TidyKind> *)in_stack_fffffffffffffef0);
  TidyConfig::toggleGroup
            ((TidyConfig *)this_00,(TidyKind)((ulong)puVar2 >> 0x20),(CheckStatus)puVar2);
  return;
}

Assistant:

void TidyConfigParser::toggleAllGroupChecks(const std::string& groupName,
                                            TidyConfig::CheckStatus status) {
    auto kind = slang::tidyKindFromStr(groupName);
    if (!kind)
        reportErrorAndExit(fmt::format("Group {} does not exist", groupName));

    config.toggleGroup(kind.value(), status);
}